

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSimpleHandleManager::FreeHandle(CSimpleHandleManager *this,CPalThread *pThread,HANDLE h)

{
  bool bVar1;
  HANDLE_INDEX HVar2;
  HANDLE_INDEX hi;
  IPalObject *pobj;
  PAL_ERROR palError;
  HANDLE h_local;
  CPalThread *pThread_local;
  CSimpleHandleManager *this_local;
  
  pobj._4_4_ = 0;
  hi = 0;
  HVar2 = HandleToHandleIndex(this,h);
  Lock(this,pThread);
  bVar1 = ValidateHandle(this,h);
  if (bVar1) {
    bVar1 = HandleIsSpecial(h);
    if (bVar1) {
      fprintf(_stderr,"] %s %s:%d","FreeHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handlemgr.cpp"
              ,0xe3);
      fprintf(_stderr,"Trying to free Special Handle %p.\n",h);
      pobj._4_4_ = 6;
    }
    else {
      hi = this->m_rghteHandleTable[HVar2].u.hiNextIndex;
      this->m_rghteHandleTable[HVar2].fEntryAllocated = false;
      if (this->m_hiFreeListEnd == 0xffffffffffffffff) {
        this->m_hiFreeListStart = HVar2;
      }
      else {
        this->m_rghteHandleTable[this->m_hiFreeListEnd].u.hiNextIndex = HVar2;
      }
      this->m_rghteHandleTable[HVar2].u.hiNextIndex = 0xffffffffffffffff;
      this->m_hiFreeListEnd = HVar2;
    }
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pobj._4_4_ = 6;
  }
  Unlock(this,pThread);
  if (hi != 0) {
    (**(code **)(*(long *)hi + 0x40))(hi,pThread);
  }
  return pobj._4_4_;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::FreeHandle(
    CPalThread *pThread,
    HANDLE h
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobj = NULL;
    HANDLE_INDEX hi = HandleToHandleIndex(h);

    Lock(pThread);

    if (!ValidateHandle(h))
    {
        ERROR("Trying to free invalid handle %p.\n", h);
        palError = ERROR_INVALID_HANDLE;
        goto FreeHandleExit;
    }

    if (HandleIsSpecial(h))
    {
        ASSERT("Trying to free Special Handle %p.\n", h);
        palError = ERROR_INVALID_HANDLE;
        goto FreeHandleExit;
    }

    pobj = m_rghteHandleTable[hi].u.pObject;
    m_rghteHandleTable[hi].fEntryAllocated = FALSE;

    /* add handle to the free pool */
    if(m_hiFreeListEnd != c_hiInvalid)
    {
        m_rghteHandleTable[m_hiFreeListEnd].u.hiNextIndex = hi;
    }
    else
    {
        m_hiFreeListStart = hi;
    }
    
    m_rghteHandleTable[hi].u.hiNextIndex = c_hiInvalid;
    m_hiFreeListEnd = hi;

FreeHandleExit:    

    Unlock(pThread);

    if (NULL != pobj)
    {
        pobj->ReleaseReference(pThread);
    }

    return palError;
}